

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O0

void __thiscall json_service::sum(json_service *this,int x,int y)

{
  ostream *poVar1;
  runtime_error *this_00;
  int in_EDX;
  value *in_RDI;
  ostringstream oss;
  int *in_stack_fffffffffffffdf8;
  value *in_stack_fffffffffffffe00;
  string local_1b8 [48];
  ostringstream local_188 [392];
  
  if (in_EDX != 10) {
    cppcms::json::value::value<int>(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    cppcms::rpc::json_rpc_server::return_result(in_RDI);
    cppcms::json::value::~value((value *)0x11dc48);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"Error ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/jsonrpc_test.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x3d);
  std::operator<<(poVar1," y!=10");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this_00,local_1b8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void sum(int x,int y)
	{
        TEST(y!=10);
		return_result(x+y);
	}